

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

input_t vischar_move_u(tgestate_t *state,vischar_t *vischar,int scale)

{
  short sVar1;
  int16_t delta;
  int scale_local;
  vischar_t *vischar_local;
  tgestate_t *state_local;
  input_t local_4;
  
  sVar1 = (vischar->mi).mappos.u - (ushort)(vischar->target).u * (short)scale;
  if (sVar1 < 3) {
    if (sVar1 < -2) {
      local_4 = 4;
    }
    else {
      vischar->counter_and_flags = vischar->counter_and_flags | 0x20;
      local_4 = 0;
    }
  }
  else {
    local_4 = 8;
  }
  return local_4;
}

Assistant:

input_t vischar_move_u(tgestate_t *state,
                       vischar_t  *vischar,
                       int         scale)
{
  int16_t delta; /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert(scale == 1 || scale == 4 || scale == 8);

  /* I'm assuming here (until proven otherwise) that HL and IY point to the
   * same vischar on entry. */
  assert(vischar == state->IY);

  // which one's the target value?
  // one will be "where i am" one will be "where i need to be"
  // suspect that mi.pos.x is "where i am"
  // and that pos.x is "where i need to be"

  delta = (int16_t) vischar->mi.mappos.u - (int16_t) vischar->target.u * scale;
  /* Conv: Rewritten to simplify. Split D,E checking boiled down to -3/+3. */
  if (delta >= 3)
    return input_RIGHT + input_DOWN;
  else if (delta <= -3)
    return input_LEFT + input_UP;
  else
  {
    vischar->counter_and_flags |= vischar_BYTE7_V_DOMINANT;
    return input_NONE;
  }
}